

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

SectionTracker *
Catch::TestCaseTracking::SectionTracker::acquire
          (TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  ITracker *parent;
  int iVar1;
  SectionTracker *in_RAX;
  undefined4 extraout_var;
  SectionTracker *this;
  Ptr<Catch::TestCaseTracking::ITracker> local_28;
  
  parent = ctx->m_currentTracker;
  local_28.m_p = (ITracker *)in_RAX;
  iVar1 = (*(parent->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
            _vptr_NonCopyable[0xe])(parent);
  this = (SectionTracker *)CONCAT44(extraout_var,iVar1);
  if (this == (SectionTracker *)0x0) {
    this = (SectionTracker *)operator_new(0x88);
    SectionTracker(this,nameAndLocation,ctx,parent);
    local_28.m_p = (ITracker *)this;
    (*(this->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])(this);
    (*(parent->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [0xd])(parent,&local_28);
    Ptr<Catch::TestCaseTracking::ITracker>::~Ptr(&local_28);
  }
  else {
    iVar1 = (*(this->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.
              super_IShared.super_NonCopyable._vptr_NonCopyable[0x10])(this);
    if ((char)iVar1 == '\0') {
      __assert_fail("childTracker->isSectionTracker()",
                    "/workspace/llm4binary/github/license_c_cmakelists/effolkronium[P]random/test/catch.hpp"
                    ,0x184b,
                    "static SectionTracker &Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext &, const NameAndLocation &)"
                   );
    }
  }
  if (ctx->m_runState != CompletedCycle) {
    tryOpen(this);
  }
  return this;
}

Assistant:

static SectionTracker& acquire( TrackerContext& ctx, NameAndLocation const& nameAndLocation ) {
            SectionTracker* section = CATCH_NULL;

            ITracker& currentTracker = ctx.currentTracker();
            if( ITracker* childTracker = currentTracker.findChild( nameAndLocation ) ) {
                assert( childTracker );
                assert( childTracker->isSectionTracker() );
                section = static_cast<SectionTracker*>( childTracker );
            }
            else {
                section = new SectionTracker( nameAndLocation, ctx, &currentTracker );
                currentTracker.addChild( section );
            }
            if( !ctx.completedCycle() )
                section->tryOpen();
            return *section;
        }